

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_rfc6979_hmac_sha256(void *arg,int iters)

{
  size_t outlen;
  secp256k1_rfc6979_hmac_sha256 rng;
  secp256k1_rfc6979_hmac_sha256 local_5c;
  
  if (0 < iters) {
    do {
      secp256k1_rfc6979_hmac_sha256_initialize(&local_5c,(uchar *)((long)arg + 0x290),0x40);
      secp256k1_rfc6979_hmac_sha256_generate(&local_5c,(uchar *)((long)arg + 0x290),outlen);
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_rfc6979_hmac_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_rfc6979_hmac_sha256 rng;

    for (i = 0; i < iters; i++) {
        secp256k1_rfc6979_hmac_sha256_initialize(&rng, data->data, 64);
        secp256k1_rfc6979_hmac_sha256_generate(&rng, data->data, 32);
    }
}